

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_alloc_NBL_mem(nifti_image *nim,int nbricks,nifti_brick_list *nbl)

{
  void **ppvVar1;
  void *pvVar2;
  uint local_2c;
  int c;
  nifti_brick_list *nbl_local;
  int nbricks_local;
  nifti_image *nim_local;
  
  if (nbricks < 1) {
    nbl->nbricks = 1;
    for (local_2c = 4; (int)local_2c <= nim->ndim; local_2c = local_2c + 1) {
      nbl->nbricks = nim->dim[(int)local_2c] * nbl->nbricks;
    }
  }
  else {
    nbl->nbricks = nbricks;
  }
  nbl->bsize = (long)nim->nx * (long)nim->ny * (long)nim->nz * (long)nim->nbyper;
  ppvVar1 = (void **)malloc((long)nbl->nbricks << 3);
  nbl->bricks = ppvVar1;
  if (nbl->bricks == (void **)0x0) {
    fprintf(_stderr,"** NANM: failed to alloc %d void ptrs\n",(ulong)(uint)nbricks);
    nim_local._4_4_ = -1;
  }
  else {
    for (local_2c = 0; (int)local_2c < nbl->nbricks; local_2c = local_2c + 1) {
      pvVar2 = malloc(nbl->bsize);
      nbl->bricks[(int)local_2c] = pvVar2;
      if (nbl->bricks[(int)local_2c] == (void *)0x0) {
        fprintf(_stderr,"** NANM: failed to alloc %u bytes for brick %d\n",nbl->bsize & 0xffffffff,
                (ulong)local_2c);
        while (0 < (int)local_2c) {
          local_2c = local_2c - 1;
          free(nbl->bricks[(int)local_2c]);
        }
        free(nbl->bricks);
        nbl->bricks = (void **)0x0;
        nbl->nbricks = 0;
        nbl->bsize = 0;
        return -1;
      }
    }
    if (2 < g_opts.debug) {
      fprintf(_stderr,"+d NANM: alloc\'d %d bricks of %u bytes for NBL\n",(ulong)(uint)nbl->nbricks,
              nbl->bsize & 0xffffffff);
    }
    nim_local._4_4_ = 0;
  }
  return nim_local._4_4_;
}

Assistant:

static int nifti_alloc_NBL_mem(nifti_image * nim, int nbricks,
                               nifti_brick_list * nbl)
{
   int c;

   /* if nbricks is not specified, use the default */
   if( nbricks > 0 ) nbl->nbricks = nbricks;
   else {  /* I missed this one with the 1.17 change    02 Mar 2006 [rickr] */
      nbl->nbricks = 1;
      for( c = 4; c <= nim->ndim; c++ )
          nbl->nbricks *= nim->dim[c];
   }

   nbl->bsize   = (size_t)nim->nx * nim->ny * nim->nz * nim->nbyper;/* bytes */
   nbl->bricks  = (void **)malloc(nbl->nbricks * sizeof(void *));

   if( ! nbl->bricks ){
      fprintf(stderr,"** NANM: failed to alloc %d void ptrs\n",nbricks);
      return -1;
   }

   for( c = 0; c < nbl->nbricks; c++ ){
      nbl->bricks[c] = (void *)malloc(nbl->bsize);
      if( ! nbl->bricks[c] ){
         fprintf(stderr,"** NANM: failed to alloc %u bytes for brick %d\n",
                 (unsigned int)nbl->bsize, c);
         /* so free and clear everything before returning */
         while( c > 0 ){
            c--;
            free(nbl->bricks[c]);
         }
         free(nbl->bricks);
         nbl->bricks = NULL;
         nbl->bsize = nbl->nbricks = 0;
         return -1;
      }
   }

   if( g_opts.debug > 2 )
      fprintf(stderr,"+d NANM: alloc'd %d bricks of %u bytes for NBL\n",
              nbl->nbricks, (unsigned int)nbl->bsize);

   return 0;
}